

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O0

QVariant * __thiscall QUndoModel::data(QUndoModel *this,QModelIndex *index,int role)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int in_ECX;
  QModelIndex *in_RDX;
  long in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RSI + 0x10) == 0) {
    ::QVariant::QVariant((QVariant *)0xa98541);
  }
  else {
    iVar1 = QModelIndex::column(in_RDX);
    if (iVar1 == 0) {
      iVar1 = QModelIndex::row(in_RDX);
      if (-1 < iVar1) {
        iVar1 = QModelIndex::row(in_RDX);
        iVar2 = QUndoStack::count();
        if (iVar1 <= iVar2) {
          if (in_ECX == 0) {
            iVar1 = QModelIndex::row(in_RDX);
            if (iVar1 == 0) {
              ::QVariant::QVariant(in_RDI,(QString *)(in_RSI + 0x20));
            }
            else {
              QModelIndex::row(in_RDX);
              QUndoStack::text((int)local_20);
              ::QVariant::QVariant(in_RDI,(QString *)local_20);
              QString::~QString((QString *)0xa9861d);
            }
          }
          else if (in_ECX == 1) {
            iVar1 = QModelIndex::row(in_RDX);
            iVar2 = QUndoStack::cleanIndex();
            if (iVar1 == iVar2) {
              uVar3 = QIcon::isNull();
              if ((uVar3 & 1) == 0) {
                QIcon::operator_cast_to_QVariant((QIcon *)in_RDI);
                goto LAB_00a9868d;
              }
            }
            ::QVariant::QVariant((QVariant *)0xa9867f);
          }
          else {
            ::QVariant::QVariant((QVariant *)0xa9868d);
          }
          goto LAB_00a9868d;
        }
      }
      ::QVariant::QVariant((QVariant *)0xa985a5);
    }
    else {
      ::QVariant::QVariant((QVariant *)0xa9855f);
    }
  }
LAB_00a9868d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QUndoModel::data(const QModelIndex &index, int role) const
{
    if (m_stack == nullptr)
        return QVariant();

    if (index.column() != 0)
        return QVariant();

    if (index.row() < 0 || index.row() > m_stack->count())
        return QVariant();

    if (role == Qt::DisplayRole) {
        if (index.row() == 0)
            return m_emty_label;
        return m_stack->text(index.row() - 1);
    } else if (role == Qt::DecorationRole) {
        if (index.row() == m_stack->cleanIndex() && !m_clean_icon.isNull())
            return m_clean_icon;
        return QVariant();
    }

    return QVariant();
}